

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O0

string * __thiscall
tinyusdz::crate::GetCrateDataTypeName_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,int32_t type_id)

{
  char *pcVar1;
  bool bVar2;
  value_type *pvVar3;
  allocator local_59;
  char *local_58;
  CrateDataType dty;
  undefined1 local_40 [8];
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  int32_t type_id_local;
  
  tyRet.contained.
  super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._36_4_ = SUB84(this,0);
  GetCrateDataType_abi_cxx11_
            ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,(crate *)((ulong)this & 0xffffffff),type_id);
  bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_40);
  if (bVar2) {
    pvVar3 = nonstd::expected_lite::
             expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_40);
    pcVar1 = pvVar3->name;
    dty.name = *(char **)&pvVar3->dtype_id;
    local_58 = pcVar1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_59);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[Invalid]",(allocator *)&dty.field_0xf);
    ::std::allocator<char>::~allocator((allocator<char> *)&dty.field_0xf);
  }
  dty.dtype_id = CRATE_DATA_TYPE_BOOL;
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeName(int32_t type_id) {
  auto tyRet = GetCrateDataType(type_id);
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType dty = tyRet.value();
  return dty.name;
}